

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O0

rfc5444_result
rfc5444_writer_add_addrtlv
          (rfc5444_writer *writer,rfc5444_writer_address *addr,rfc5444_writer_tlvtype *tlvtype,
          void *value,size_t length,_Bool allow_dup)

{
  avl_node *paVar1;
  rfc5444_writer_addrtlv *prVar2;
  void *pvVar3;
  rfc5444_writer_addrtlv *addrtlv;
  _Bool allow_dup_local;
  size_t length_local;
  void *value_local;
  rfc5444_writer_tlvtype *tlvtype_local;
  rfc5444_writer_address *addr_local;
  rfc5444_writer *writer_local;
  
  if (writer->_state != RFC5444_WRITER_ADD_ADDRESSES) {
    __assert_fail("writer->_state == RFC5444_WRITER_ADD_ADDRESSES",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                  ,0xc4,
                  "enum rfc5444_result rfc5444_writer_add_addrtlv(struct rfc5444_writer *, struct rfc5444_writer_address *, struct rfc5444_writer_tlvtype *, const void *, size_t, _Bool)"
                 );
  }
  if ((!allow_dup) &&
     (paVar1 = avl_find(&addr->_addrtlv_tree,&tlvtype->_full_type), paVar1 != (avl_node *)0x0)) {
    return RFC5444_DUPLICATE_TLV;
  }
  prVar2 = (*writer->malloc_addrtlv_entry)();
  if (prVar2 == (rfc5444_writer_addrtlv *)0x0) {
    writer_local._4_4_ = RFC5444_OUT_OF_MEMORY;
  }
  else {
    prVar2->address = addr;
    prVar2->tlvtype = tlvtype;
    prVar2->length = (uint16_t)length;
    if (length != 0) {
      pvVar3 = _copy_addrtlv_value(writer,value,length);
      prVar2->value = pvVar3;
      if (pvVar3 == (void *)0x0) {
        (*writer->free_addrtlv_entry)(prVar2);
        return RFC5444_OUT_OF_ADDRTLV_MEM;
      }
    }
    (prVar2->addrtlv_node).key = &tlvtype->_full_type;
    avl_insert(&addr->_addrtlv_tree,&prVar2->addrtlv_node);
    writer_local._4_4_ = RFC5444_OKAY;
  }
  return writer_local._4_4_;
}

Assistant:

enum rfc5444_result
rfc5444_writer_add_addrtlv(struct rfc5444_writer *writer, struct rfc5444_writer_address *addr,
  struct rfc5444_writer_tlvtype *tlvtype, const void *value, size_t length, bool allow_dup)
{
  struct rfc5444_writer_addrtlv *addrtlv;

#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_ADD_ADDRESSES);
#endif

  /* check for collision if necessary */
  if (!allow_dup && avl_find(&addr->_addrtlv_tree, &tlvtype->_full_type) != NULL) {
    return RFC5444_DUPLICATE_TLV;
  }

  if ((addrtlv = writer->malloc_addrtlv_entry()) == NULL) {
    /* out of memory error */
    return RFC5444_OUT_OF_MEMORY;
  }

  /* set back pointer */
  addrtlv->address = addr;
  addrtlv->tlvtype = tlvtype;

  /* copy value(length) */
  addrtlv->length = length;
  if (length > 0 && (addrtlv->value = _copy_addrtlv_value(writer, value, length)) == NULL) {
    writer->free_addrtlv_entry(addrtlv);
    return RFC5444_OUT_OF_ADDRTLV_MEM;
  }

  /* add to address tree */
  addrtlv->addrtlv_node.key = &tlvtype->_full_type;
  avl_insert(&addr->_addrtlv_tree, &addrtlv->addrtlv_node);

  return RFC5444_OKAY;
}